

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

bool __thiscall cmGlobalGenerator::CheckTargetsForType(cmGlobalGenerator *this)

{
  pointer ppcVar1;
  pointer ppcVar2;
  cmGeneratorTarget *this_00;
  cmake *this_01;
  bool bVar3;
  byte bVar4;
  pointer ppcVar5;
  undefined8 uVar6;
  pointer ppcVar7;
  pointer pbVar8;
  pointer config;
  allocator<char> local_cd;
  undefined4 local_cc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  string local_80;
  undefined1 local_60 [48];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"Swift",(allocator<char> *)&configs);
  bVar3 = GetLanguageEnabled(this,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  if (bVar3) {
    ppcVar5 = (this->LocalGenerators).
              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppcVar1 = (this->LocalGenerators).
              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    local_cc = 0;
    for (; ppcVar5 != ppcVar1; ppcVar5 = ppcVar5 + 1) {
      ppcVar2 = ((*ppcVar5)->GeneratorTargets).
                super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      for (ppcVar7 = ((*ppcVar5)->GeneratorTargets).
                     super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                     _M_impl.super__Vector_impl_data._M_start; ppcVar7 != ppcVar2;
          ppcVar7 = ppcVar7 + 1) {
        this_00 = *ppcVar7;
        configs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        configs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        configs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        cmMakefile::GetConfigurations((string *)(local_60 + 0x10),this_00->Makefile,&configs,true);
        std::__cxx11::string::~string((string *)(local_60 + 0x10));
        pbVar8 = configs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        config = configs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (configs.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            configs.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::emplace_back<>(&configs);
          pbVar8 = configs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          config = configs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        }
        for (; config != pbVar8; config = config + 1) {
          cmGeneratorTarget::GetLinkerLanguage(&local_80,this_00,config);
          bVar3 = std::operator==(&local_80,"Swift");
          std::__cxx11::string::~string((string *)&local_80);
          if (bVar3) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_80,"WIN32_EXECUTABLE",(allocator<char> *)local_60);
            bVar3 = cmGeneratorTarget::GetPropertyAsBool(this_00,&local_80);
            std::__cxx11::string::~string((string *)&local_80);
            if (bVar3) {
              this_01 = this->CMakeInstance;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_80,
                         "WIN32_EXECUTABLE property is not supported on Swift executables",&local_cd
                        );
              cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_60);
              cmake::IssueMessage(this_01,FATAL_ERROR,&local_80,(cmListFileBacktrace *)local_60);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 8));
              uVar6 = std::__cxx11::string::~string((string *)&local_80);
              local_cc = (undefined4)CONCAT71((int7)((ulong)uVar6 >> 8),1);
            }
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&configs);
      }
    }
    bVar4 = (byte)local_cc;
  }
  else {
    bVar4 = 0;
  }
  return (bool)(bVar4 & 1);
}

Assistant:

bool cmGlobalGenerator::CheckTargetsForType() const
{
  if (!this->GetLanguageEnabled("Swift")) {
    return false;
  }
  bool failed = false;
  for (cmLocalGenerator* generator : this->LocalGenerators) {
    for (cmGeneratorTarget* target : generator->GetGeneratorTargets()) {
      std::vector<std::string> configs;
      target->Makefile->GetConfigurations(configs);
      if (configs.empty()) {
        configs.emplace_back();
      }

      for (std::string const& config : configs) {
        if (target->GetLinkerLanguage(config) == "Swift") {
          if (target->GetPropertyAsBool("WIN32_EXECUTABLE")) {
            this->GetCMakeInstance()->IssueMessage(
              MessageType::FATAL_ERROR,
              "WIN32_EXECUTABLE property is not supported on Swift "
              "executables",
              target->GetBacktrace());
            failed = true;
          }
        }
      }
    }
  }
  return failed;
}